

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::RuleTests_RemainingSpanWithNT_Test::RuleTests_RemainingSpanWithNT_Test
          (RuleTests_RemainingSpanWithNT_Test *this)

{
  RuleTests_RemainingSpanWithNT_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__RuleTests_RemainingSpanWithNT_Test_001be460;
  return;
}

Assistant:

TEST(RuleTests, RemainingSpanWithNT) {
  auto asp = readAlignedSentencePair<false, false>("a c e\tb d f\t0-0 1-1 2-2");
  PhrasalRule rule{asp};
  SpanPair nt{{1, 2}, {1, 2}};
  rule.nts.front() = nt;
  rule.nextNT++;
  Span s{2, 3};
  EXPECT_EQ(s, rule.remainingSource());
}